

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::TextureCubeArrayShader
          (TextureCubeArrayShader *this,DataType samplerType,DataType outputType,
          GLSLVersion glslVersion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Vector<tcu::Vector<float,_3>,_3> *pVVar2;
  Vector<float,_3> *pVVar3;
  ShaderProgramDeclaration *pSVar4;
  long *plVar5;
  long lVar6;
  Mat3 *pMVar7;
  InternalError *this_00;
  long *plVar8;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  long *local_508;
  long local_4f8;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  long lStack_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  long *local_428;
  long local_420;
  long local_418;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  long *local_388;
  long local_380;
  long local_378 [2];
  long *local_368;
  long local_360;
  long local_358 [2];
  long *local_348;
  long local_340;
  long local_338 [2];
  long *local_328;
  long local_320;
  long local_318 [2];
  long *local_308 [2];
  long local_2f8 [2];
  long *local_2e8 [2];
  long local_2d8 [2];
  VertexSource local_2c8;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  FragmentOutput local_284;
  Uniform local_280;
  Uniform local_258;
  Uniform local_230;
  Uniform local_208;
  Uniform local_1e0;
  VertexAttribute local_1b8;
  VertexAttribute local_190;
  FragmentSource local_168;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"a_position","");
  local_190.name._M_dataplus._M_p = (pointer)&local_190.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_328,local_320 + (long)local_328);
  local_190.type = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_190);
  local_348 = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"a_coord","");
  local_1b8.name._M_dataplus._M_p = (pointer)&local_1b8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_348,local_340 + (long)local_348);
  local_1b8.type = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_1b8);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_148);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_284.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_284.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_284.type = GENERICVECTYPE_INT32;
  }
  else {
    local_284.type = GENERICVECTYPE_LAST;
  }
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_284);
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"u_coordMat","");
  local_1e0.name._M_dataplus._M_p = (pointer)&local_1e0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_368,local_360 + (long)local_368);
  local_1e0.type = TYPE_FLOAT_MAT3;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_1e0);
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"u_sampler0","");
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_388,local_380 + (long)local_388);
  local_208.type = samplerType;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_208);
  local_3a8 = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"u_scale","");
  local_230.name._M_dataplus._M_p = (pointer)&local_230.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_3a8,local_3a0 + (long)local_3a8);
  local_230.type = TYPE_FLOAT_VEC4;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_230);
  local_3c8 = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"u_bias","");
  local_258.name._M_dataplus._M_p = (pointer)&local_258.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_3c8,local_3c0 + (long)local_3c8);
  local_258.type = TYPE_FLOAT_VEC4;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_258);
  local_3e8 = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"u_layer","");
  local_280.name._M_dataplus._M_p = (pointer)&local_280.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,local_3e8,local_3e0 + (long)local_3e8);
  local_280.type = TYPE_INT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_280);
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,0x1b32ab9);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_2e8);
  local_408 = &local_3f8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_3f8 = *plVar8;
    lStack_3f0 = plVar5[3];
  }
  else {
    local_3f8 = *plVar8;
    local_408 = (long *)*plVar5;
  }
  local_400 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_408);
  local_508 = &local_4f8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_4f8 = *plVar8;
    uStack_4f0 = (undefined4)plVar5[3];
    uStack_4ec = *(undefined4 *)((long)plVar5 + 0x1c);
  }
  else {
    local_4f8 = *plVar8;
    local_508 = (long *)*plVar5;
  }
  lVar6 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_2c8.source._M_dataplus._M_p = (pointer)&local_2c8.source.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2c8,local_508,lVar6 + (long)local_508);
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_2c8);
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,0x1b32ab9);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_308);
  local_488 = &local_478;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_478 = *plVar8;
    lStack_470 = plVar5[3];
  }
  else {
    local_478 = *plVar8;
    local_488 = (long *)*plVar5;
  }
  local_480 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_488);
  local_4e8 = &local_4d8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_4d8 = *plVar8;
    lStack_4d0 = plVar5[3];
  }
  else {
    local_4d8 = *plVar8;
    local_4e8 = (long *)*plVar5;
  }
  local_4e0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  glu::getDataTypeName(samplerType);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4e8);
  local_468 = &local_458;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_458 = *plVar8;
    lStack_450 = plVar5[3];
  }
  else {
    local_458 = *plVar8;
    local_468 = (long *)*plVar5;
  }
  local_460 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_468);
  local_4c8 = &local_4b8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_4b8 = *plVar8;
    lStack_4b0 = plVar5[3];
  }
  else {
    local_4b8 = *plVar8;
    local_4c8 = (long *)*plVar5;
  }
  local_4c0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  local_448 = &local_438;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_438 = *plVar8;
    lStack_430 = plVar5[3];
  }
  else {
    local_438 = *plVar8;
    local_448 = (long *)*plVar5;
  }
  local_440 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_448);
  local_4a8 = &local_498;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_498 = *plVar8;
    lStack_490 = plVar5[3];
  }
  else {
    local_498 = *plVar8;
    local_4a8 = (long *)*plVar5;
  }
  local_4a0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4a8);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_298 = *plVar8;
    lStack_290 = plVar5[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *plVar8;
    local_2a8 = (long *)*plVar5;
  }
  local_2a0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_418 = *plVar8;
    uStack_410 = (undefined4)plVar5[3];
    uStack_40c = *(undefined4 *)((long)plVar5 + 0x1c);
    local_428 = &local_418;
  }
  else {
    local_418 = *plVar8;
    local_428 = (long *)*plVar5;
  }
  local_420 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  paVar1 = &local_168.source.field_2;
  local_168.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_428,local_420 + (long)local_428);
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_168);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.source._M_dataplus._M_p,
                    local_168.source.field_2._M_allocated_capacity + 1);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428,local_418 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,local_498 + 1);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,local_438 + 1);
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,local_4b8 + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if (local_4e8 != &local_4d8) {
    operator_delete(local_4e8,local_4d8 + 1);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488,local_478 + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.source._M_dataplus._M_p != &local_2c8.source.field_2) {
    operator_delete(local_2c8.source._M_dataplus._M_p,
                    local_2c8.source.field_2._M_allocated_capacity + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,local_4f8 + 1);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,local_3f8 + 1);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
    operator_delete(local_280.name._M_dataplus._M_p,local_280.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8,local_3d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.name._M_dataplus._M_p != &local_258.name.field_2) {
    operator_delete(local_258.name._M_dataplus._M_p,local_258.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8,local_3b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.name._M_dataplus._M_p != &local_230.name.field_2) {
    operator_delete(local_230.name._M_dataplus._M_p,local_230.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8,local_398[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_388 != local_378) {
    operator_delete(local_388,local_378[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.name._M_dataplus._M_p != &local_1e0.name.field_2) {
    operator_delete(local_1e0.name._M_dataplus._M_p,local_1e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_368 != local_358) {
    operator_delete(local_368,local_358[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.name._M_dataplus._M_p != &local_1b8.name.field_2) {
    operator_delete(local_1b8.name._M_dataplus._M_p,local_1b8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,local_190.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_328 != local_318) {
    operator_delete(local_328,local_318[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_021a1798;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_021a17d0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_021a17e8;
  lVar6 = 0x55;
  do {
    *(undefined4 *)
     ((long)&(this->super_ShaderProgram).super_VertexShader._vptr_VertexShader + lVar6 * 4) =
         0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x59);
  (this->m_texBias).m_data[0] = 0.0;
  (this->m_texBias).m_data[1] = 0.0;
  (this->m_texBias).m_data[2] = 0.0;
  (this->m_texBias).m_data[3] = 0.0;
  pMVar7 = &this->m_coordMat;
  this->m_layer = 0;
  (this->m_coordMat).m_data.m_data[0].m_data[0] = 0.0;
  pVVar2 = &(this->m_coordMat).m_data;
  pVVar2->m_data[0].m_data[1] = 0.0;
  pVVar2->m_data[0].m_data[2] = 0.0;
  pVVar2 = &(this->m_coordMat).m_data;
  pVVar2->m_data[1].m_data[0] = 0.0;
  pVVar2->m_data[1].m_data[1] = 0.0;
  *(undefined8 *)((this->m_coordMat).m_data.m_data[1].m_data + 2) = 0;
  pVVar3 = (this->m_coordMat).m_data.m_data;
  pVVar3[2].m_data[1] = 0.0;
  pVVar3[2].m_data[2] = 0.0;
  lVar6 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar6 != lVar10) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)(pMVar7->m_data).m_data[0].m_data + lVar10) = uVar11;
      lVar10 = lVar10 + 0xc;
    } while (lVar10 != 0x24);
    lVar9 = lVar9 + 1;
    pMVar7 = (Mat3 *)((pMVar7->m_data).m_data[0].m_data + 1);
    lVar6 = lVar6 + 0xc;
  } while (lVar9 != 3);
  this->m_outputType = outputType;
  if ((glslVersion & ~GLSL_VERSION_300_ES) == GLSL_VERSION_310_ES) {
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,
             "glslVersion == glu::GLSL_VERSION_310_ES || glslVersion == glu::GLSL_VERSION_320_ES",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestUtil.cpp"
             ,0x138);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCubeArrayShader::TextureCubeArrayShader (glu::DataType samplerType, glu::DataType outputType, glu::GLSLVersion glslVersion)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
							<< sglr::pdec::Uniform("u_coordMat", glu::TYPE_FLOAT_MAT3)
							<< sglr::pdec::Uniform("u_sampler0", samplerType)
							<< sglr::pdec::Uniform("u_scale", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_bias", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_layer", glu::TYPE_INT)
							<< sglr::pdec::VertexSource(
									string("") +
									((glslVersion == glu::GLSL_VERSION_310_ES) ?
									"#version 310 es\n"
									"#extension GL_EXT_texture_cube_map_array : require\n"
									 : "#version 320 es\n") +
									"in highp vec4 a_position;\n"
									"in mediump vec2 a_coord;\n"
									"uniform mat3 u_coordMat;\n"
									"out highp vec3 v_coord;\n"
									"void main (void)\n"
									"{\n"
									"	gl_Position = a_position;\n"
									"	v_coord = u_coordMat * vec3(a_coord, 1.0);\n"
									"}\n")
							<< sglr::pdec::FragmentSource(
									string("") +
									((glslVersion == glu::GLSL_VERSION_310_ES) ?
									"#version 310 es\n"
									"#extension GL_EXT_texture_cube_map_array : require\n"
									 : "#version 320 es\n") +
									"uniform highp " + glu::getDataTypeName(samplerType) + " u_sampler0;\n"
									"uniform highp vec4 u_scale;\n"
									"uniform highp vec4 u_bias;\n"
									"uniform highp int u_layer;\n"
									"in highp vec3 v_coord;\n"
									"layout(location = 0) out highp " + glu::getDataTypeName(outputType) + " o_color;\n"
									"void main (void)\n"
									"{\n"
									"	o_color = " + glu::getDataTypeName(outputType) + "(vec4(texture(u_sampler0, vec4(v_coord, u_layer))) * u_scale + u_bias);\n"
									"}\n"))
	, m_texScale	(1.0f)
	, m_texBias		(0.0f)
	, m_layer		(0)
	, m_outputType	(outputType)
{
	TCU_CHECK_INTERNAL(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion == glu::GLSL_VERSION_320_ES);
}